

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O0

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinSCAN_C>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *tau_a;
  double *eps_00;
  double *vrho_a;
  long in_RCX;
  long in_RDX;
  double *unaff_RBX;
  double in_RSI;
  int in_EDI;
  double in_R8;
  double in_R9;
  double *in_XMM0_Qa;
  double *unaff_retaddr;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  double vtb;
  double vta;
  double vlb;
  double vla;
  double vsbb;
  double vsab;
  double vsaa;
  double vrb;
  double vra;
  double e;
  double lapl_b_use;
  double lapl_a_use;
  double *vlapl_i;
  double *vtau_i;
  double *vsigma_i;
  double *vrho_i;
  double *lapl_i;
  double *tau_i;
  double *sigma_i;
  double *rho_i;
  int32_t i;
  double local_e8;
  double local_e0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe8;
  
  for (iVar1 = 0; iVar1 < in_EDI; iVar1 = iVar1 + 1) {
    tau_a = (double *)(in_stack_00000008 + (long)(iVar1 << 1) * 8);
    eps_00 = (double *)(in_stack_00000010 + (long)(iVar1 * 3) * 8);
    vrho_a = (double *)(in_stack_00000020 + (long)(iVar1 << 1) * 8);
    mgga_screening_interface<ExchCXX::BuiltinSCAN_C>::eval_exc_vxc_polar
              (in_R8,in_R9,(double)CONCAT44(iVar1,in_stack_ffffffffffffffb8),
               (double)((long)in_RSI + (long)(iVar1 << 1) * 8),
               (double)(in_RDX + (long)(iVar1 * 3) * 8),
               (double)((long)in_R8 + (long)(iVar1 << 1) * 8),
               (double)(in_RCX + (long)(iVar1 << 1) * 8),(double)tau_a,in_RSI,eps_00,vrho_a,
               (double *)(in_stack_00000018 + (long)(iVar1 << 1) * 8),(double *)0x0,(double *)0x0,
               in_stack_ffffffffffffff60,(double *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),
               in_XMM0_Qa,unaff_RBX,unaff_retaddr);
    *(double *)((long)in_R9 + (long)iVar1 * 8) =
         (double)in_XMM0_Qa * (double)in_stack_ffffffffffffff60 +
         *(double *)((long)in_R9 + (long)iVar1 * 8);
    *tau_a = (double)in_XMM0_Qa * local_a8 + *tau_a;
    tau_a[1] = (double)in_XMM0_Qa * local_b0 + tau_a[1];
    *eps_00 = (double)in_XMM0_Qa * local_b8 + *eps_00;
    eps_00[1] = (double)in_XMM0_Qa * local_c0 + eps_00[1];
    eps_00[2] = (double)in_XMM0_Qa * local_c8 + eps_00[2];
    *vrho_a = (double)in_XMM0_Qa * local_e0 + *vrho_a;
    vrho_a[1] = (double)in_XMM0_Qa * local_e8 + vrho_a[1];
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;

    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double e, vra, vrb, vsaa,vsab,vsbb, vla, vlb, vta, vtb;

    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      e, vra, vrb, vsaa, vsab, vsbb, vla, vlb, vta, vtb );

    eps[i]      += scal_fact * e;
    vrho_i[0]   += scal_fact * vra;
    vrho_i[1]   += scal_fact * vrb;
    vsigma_i[0] += scal_fact * vsaa;
    vsigma_i[1] += scal_fact * vsab;
    vsigma_i[2] += scal_fact * vsbb;
    vtau_i[0]   += scal_fact * vta;
    vtau_i[1]   += scal_fact * vtb;
    if(traits::needs_laplacian) {
      vlapl_i[0] += scal_fact * vla;
      vlapl_i[1] += scal_fact * vlb;
    }

  }

}